

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

Token slang::parsing::Token::createMissing
                (BumpAllocator *alloc,TokenKind kind,SourceLocation location)

{
  ulong uVar1;
  int iVar2;
  string_view strText;
  TokenKind kind_00;
  Token *this;
  undefined6 in_register_00000032;
  Token TVar3;
  byte bVar4;
  Token local_a8;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  char *pcStack_20;
  Token local_18;
  
  iVar2 = (int)CONCAT62(in_register_00000032,kind);
  switch(iVar2) {
  case 5:
    local_58 = 0;
    pcStack_50 = "";
    this = &local_a8;
    Token(this,alloc,IntegerLiteral,
          (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x344831) << 0x40),location,(SVInt *)SVInt::Zero);
    break;
  case 6:
    local_68 = 0;
    pcStack_60 = "";
    this = &local_a8;
    Token(this,alloc,IntegerBase,
          (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x344831) << 0x40),location,Decimal,false);
    break;
  case 7:
    local_78 = 0;
    pcStack_70 = "";
    this = &local_a8;
    Token(this,alloc,UnbasedUnsizedLiteral,
          (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x344831) << 0x40),location,(logic_t)0x80);
    break;
  case 8:
    local_88 = 0;
    pcStack_80 = "";
    bVar4 = 0;
    kind_00 = RealLiteral;
    goto LAB_00188324;
  case 9:
    local_98 = 0;
    pcStack_90 = "";
    bVar4 = 1;
    kind_00 = TimeLiteral;
LAB_00188324:
    this = &local_a8;
    Token(this,alloc,kind_00,(span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x344831) << 0x40),location,0.0,false,
          (optional<slang::TimeUnit>)((ushort)bVar4 << 8));
    break;
  default:
    if ((iVar2 == 0x158) || (iVar2 == 0x15a)) {
      local_48 = 0;
      pcStack_40 = "";
      this = &local_a8;
      Token(this,alloc,kind,(span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
            (string_view)(ZEXT816(0x344831) << 0x40),location,Unknown);
      break;
    }
    if (iVar2 != 0x159) {
      local_a8.kind = Unknown;
      local_a8._2_1_ = 0;
      local_a8.numFlags.raw = '\0';
      local_a8.rawLen = 0;
      this = &local_18;
      local_18.numFlags.raw = '\0';
      local_18.rawLen = 0;
      local_a8.info = (Info *)0x344831;
      local_18.info = (Info *)0x0;
      init(this,(EVP_PKEY_CTX *)alloc);
      break;
    }
  case 4:
    local_28 = 0;
    pcStack_20 = "";
    local_38 = 0;
    pcStack_30 = "";
    this = &local_a8;
    strText._M_str._1_1_ = 0x48;
    strText._0_9_ = (unkuint9)0x31 << 0x40;
    strText._M_str._2_2_ = 0x34;
    strText._M_str._4_4_ = 0;
    Token(this,alloc,kind,(span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x344831) << 0x40),location,strText);
  }
  uVar1._0_2_ = this->kind;
  uVar1._2_1_ = this->field_0x2;
  uVar1._3_1_ = this->numFlags;
  uVar1._4_4_ = this->rawLen;
  TVar3._0_8_ = uVar1 | 0x10000;
  TVar3.info = this->info;
  return TVar3;
}

Assistant:

Token Token::createMissing(BumpAllocator& alloc, TokenKind kind, SourceLocation location) {
    Token result;
    switch (kind) {
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
            result = Token(alloc, kind, {}, "", location, "");
            break;
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
            result = Token(alloc, kind, {}, "", location, SyntaxKind::Unknown);
            break;
        case TokenKind::IntegerLiteral:
            result = Token(alloc, kind, {}, "", location, SVInt::Zero);
            break;
        case TokenKind::IntegerBase:
            result = Token(alloc, kind, {}, "", location, LiteralBase::Decimal, false);
            break;
        case TokenKind::UnbasedUnsizedLiteral:
            result = Token(alloc, kind, {}, "", location, logic_t::x);
            break;
        case TokenKind::RealLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, std::nullopt);
            break;
        case TokenKind::TimeLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, TimeUnit::Seconds);
            break;
        default:
            result = Token(alloc, kind, {}, "", location);
            break;
    }

    result.missing = true;
    return result;
}